

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsTestDriver.cpp
# Opt level: O0

bool __thiscall
xs::TestDriver::pollBuffer(TestDriver *this,ByteBuffer *messageBuffer,MessageType msgType)

{
  TestProcess *pTVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  int local_48;
  int msgSize;
  int numRead;
  int maxMsgSize;
  int minBytesAvailable;
  MessageType msgType_local;
  ByteBuffer *messageBuffer_local;
  TestDriver *this_local;
  
  iVar2 = de::RingBuffer<unsigned_char>::getNumFree(messageBuffer);
  if (iVar2 < 0x28) {
    this_local._7_1_ = false;
  }
  else {
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_dataMsgTmpBuf)
    ;
    iVar2 = de::RingBuffer<unsigned_char>::getNumFree(messageBuffer);
    iVar2 = de::min<int>((int)sVar3,iVar2);
    if (msgType == MESSAGETYPE_PROCESS_LOG_DATA) {
      pTVar1 = this->m_process;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->m_dataMsgTmpBuf,8);
      local_48 = (*pTVar1->_vptr_TestProcess[7])(pTVar1,pvVar4,(ulong)(iVar2 - 9));
    }
    else {
      pTVar1 = this->m_process;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->m_dataMsgTmpBuf,8);
      local_48 = (*pTVar1->_vptr_TestProcess[8])(pTVar1,pvVar4,(ulong)(iVar2 - 9));
    }
    if (local_48 < 1) {
      this_local._7_1_ = false;
    }
    else {
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->m_dataMsgTmpBuf,(long)(local_48 + 8));
      *pvVar4 = '\0';
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->m_dataMsgTmpBuf,0);
      Message::writeHeader(msgType,(long)(local_48 + 9),pvVar4,8);
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->m_dataMsgTmpBuf,0);
      de::RingBuffer<unsigned_char>::pushFront(messageBuffer,pvVar4,local_48 + 9);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TestDriver::pollBuffer (ByteBuffer& messageBuffer, MessageType msgType)
{
	const int minBytesAvailable = MESSAGE_HEADER_SIZE + MIN_MSG_PAYLOAD_SIZE;

	if (messageBuffer.getNumFree() < minBytesAvailable)
		return false; // Not enough space in message buffer.

	const int	maxMsgSize	= de::min((int)m_dataMsgTmpBuf.size(), messageBuffer.getNumFree());
	int			numRead		= 0;
	int			msgSize		= MESSAGE_HEADER_SIZE+1; // One byte is reserved for terminating 0.

	// Fill in data \note Last byte is reserved for 0.
	numRead = msgType == MESSAGETYPE_PROCESS_LOG_DATA
			? m_process->readTestLog(&m_dataMsgTmpBuf[MESSAGE_HEADER_SIZE], maxMsgSize-MESSAGE_HEADER_SIZE-1)
			: m_process->readInfoLog(&m_dataMsgTmpBuf[MESSAGE_HEADER_SIZE], maxMsgSize-MESSAGE_HEADER_SIZE-1);

	if (numRead <= 0)
		return false; // Didn't get any data.

	msgSize += numRead;

	// Terminate with 0.
	m_dataMsgTmpBuf[msgSize-1] = 0;

	// Write header.
	Message::writeHeader(msgType, msgSize, &m_dataMsgTmpBuf[0], MESSAGE_HEADER_SIZE);

	// Write to messagebuffer.
	messageBuffer.pushFront(&m_dataMsgTmpBuf[0], msgSize);

	DBG_PRINT(("  wrote %d bytes of %s data\n", msgSize, msgType == MESSAGETYPE_INFO ? "info" : "log"));

	return true;
}